

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::NewClassExpressionSyntax::setChild
          (NewClassExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  long in_RSI;
  long in_RDI;
  ArgumentListSyntax *local_40;
  NameSyntax *local_38;
  NameSyntax *local_20;
  not_null<slang::syntax::NameSyntax_*> local_18 [3];
  
  if (in_RSI == 0) {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x23324a);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_38 = (NameSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x23325a);
      local_38 = SyntaxNode::as<slang::syntax::NameSyntax>(pSVar1);
    }
    local_20 = local_38;
    not_null<slang::syntax::NameSyntax_*>::not_null<slang::syntax::NameSyntax_*>(local_18,&local_20)
    ;
    *(NameSyntax **)(in_RDI + 0x18) = local_18[0].ptr;
  }
  else {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x2332a5);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_40 = (ArgumentListSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x2332b5);
      local_40 = SyntaxNode::as<slang::syntax::ArgumentListSyntax>(pSVar1);
    }
    *(ArgumentListSyntax **)(in_RDI + 0x20) = local_40;
  }
  return;
}

Assistant:

void NewClassExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: scopedNew = child.node() ? &child.node()->as<NameSyntax>() : nullptr; return;
        case 1: argList = child.node() ? &child.node()->as<ArgumentListSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}